

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::GenerateFieldInitializers
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  int iVar2;
  FieldGenerator *pFVar3;
  Descriptor *pDVar4;
  OneofDescriptor *oneof;
  OneofDescriptor *extraout_RDX;
  OneofDescriptor *extraout_RDX_00;
  OneofDescriptor *extraout_RDX_01;
  int i_1;
  javanano *this_00;
  long lVar5;
  int i;
  long lVar6;
  string local_50;
  
  iVar1 = (this->field_generators_).total_bits_ + 0x1f;
  iVar2 = iVar1 / 0x20;
  oneof = (OneofDescriptor *)((long)iVar1 % 0x20 & 0xffffffff);
  this_00 = (javanano *)0x0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  for (; iVar2 != (int)this_00; this_00 = (javanano *)(ulong)((int)this_00 + 1)) {
    GetBitFieldName_abi_cxx11_(&local_50,this_00,(int)oneof);
    io::Printer::Print(printer,"$bit_field_name$ = 0;\n","bit_field_name",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    oneof = extraout_RDX;
  }
  lVar5 = 0;
  for (lVar6 = 0; pDVar4 = this->descriptor_, lVar6 < *(int *)(pDVar4 + 0x2c); lVar6 = lVar6 + 1) {
    pFVar3 = FieldGeneratorMap::get
                       (&this->field_generators_,
                        (FieldDescriptor *)(*(long *)(pDVar4 + 0x30) + lVar5));
    (*pFVar3->_vptr_FieldGenerator[5])(pFVar3,printer);
    lVar5 = lVar5 + 0xa8;
    oneof = extraout_RDX_00;
  }
  lVar5 = 0;
  for (lVar6 = 0; lVar6 < *(int *)(pDVar4 + 0x38); lVar6 = lVar6 + 1) {
    UnderscoresToCapitalizedCamelCase_abi_cxx11_
              (&local_50,(javanano *)(*(long *)(pDVar4 + 0x40) + lVar5),oneof);
    io::Printer::Print(printer,"clear$oneof_capitalized_name$();\n","oneof_capitalized_name",
                       &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pDVar4 = this->descriptor_;
    lVar5 = lVar5 + 0x30;
    oneof = extraout_RDX_01;
  }
  if (this->params_->store_unknown_fields_ != false) {
    io::Printer::Print(printer,"unknownFieldData = null;\n");
  }
  io::Printer::Print(printer,"cachedSize = -1;\n");
  return;
}

Assistant:

void MessageGenerator::GenerateFieldInitializers(io::Printer* printer) {
  // Clear bit fields.
  int totalInts = (field_generators_.total_bits() + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("$bit_field_name$ = 0;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  // Call clear for all of the fields.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    field_generators_.get(field).GenerateClearCode(printer);
  }

  // Clear oneofs.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
      "clear$oneof_capitalized_name$();\n",
      "oneof_capitalized_name", UnderscoresToCapitalizedCamelCase(
          descriptor_->oneof_decl(i)));
  }

  // Clear unknown fields.
  if (params_.store_unknown_fields()) {
    printer->Print("unknownFieldData = null;\n");
  }
  printer->Print("cachedSize = -1;\n");
}